

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhAcquirePage(lhash_kv_engine *pEngine,unqlite_page **ppOut)

{
  int iVar1;
  unqlite_page *puStack_28;
  int rc;
  unqlite_page *pPage;
  unqlite_page **ppOut_local;
  lhash_kv_engine *pEngine_local;
  
  pPage = (unqlite_page *)ppOut;
  ppOut_local = (unqlite_page **)pEngine;
  if ((pEngine->nFreeList == 0) ||
     (iVar1 = (*pEngine->pIo->xGet)
                        (pEngine->pIo->pHandle,pEngine->nFreeList,&stack0xffffffffffffffd8),
     iVar1 != 0)) {
    pEngine_local._4_4_ =
         (*(code *)(*ppOut_local)[1].pUserData)((*ppOut_local)->zData,&stack0xffffffffffffffd8);
    if (pEngine_local._4_4_ == 0) {
      pPage->zData = (uchar *)puStack_28;
      pEngine_local._4_4_ = 0;
    }
  }
  else {
    SyBigEndianUnpack64(puStack_28->zData,(sxu64 *)(ppOut_local + 0x23));
    pEngine_local._4_4_ = (*(code *)(*ppOut_local)[1].iPage)(ppOut_local[0x1a]);
    if (pEngine_local._4_4_ == 0) {
      SyBigEndianPack64(ppOut_local[0x1a]->zData + 8,(sxu64)ppOut_local[0x23]);
      (*(code *)(*ppOut_local)[2].pUserData)(puStack_28);
      pPage->zData = (uchar *)puStack_28;
      pEngine_local._4_4_ = 0;
    }
  }
  return pEngine_local._4_4_;
}

Assistant:

static int lhAcquirePage(lhash_kv_engine *pEngine,unqlite_page **ppOut)
{
	unqlite_page *pPage;
	int rc;
	if( pEngine->nFreeList != 0 ){
		/* Acquire one from the free list */
		rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,pEngine->nFreeList,&pPage);
		if( rc == UNQLITE_OK ){
			/* Point to the next free page */
			SyBigEndianUnpack64(pPage->zData,&pEngine->nFreeList);
			/* Update the database header */
			rc = pEngine->pIo->xWrite(pEngine->pHeader);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			SyBigEndianPack64(&pEngine->pHeader->zData[4/*Magic*/+4/*Hash*/],pEngine->nFreeList);
			/* Tell the pager do not journal this page */
			pEngine->pIo->xDontJournal(pPage);
			/* Return to the caller */
			*ppOut = pPage;
			/* All done */
			return UNQLITE_OK;
		}
	}
	/* Acquire a new page */
	rc = pEngine->pIo->xNew(pEngine->pIo->pHandle,&pPage);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Point to the target page */
	*ppOut = pPage;
	return UNQLITE_OK;
}